

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O0

void __thiscall
crnlib::vector<crnlib::symbol_codec::output_symbol>::clear
          (vector<crnlib::symbol_codec::output_symbol> *this)

{
  vector<crnlib::symbol_codec::output_symbol> *this_local;
  
  if (this->m_p != (output_symbol *)0x0) {
    scalar_type<crnlib::symbol_codec::output_symbol>::destruct_array(this->m_p,this->m_size);
    crnlib_free(this->m_p);
    this->m_p = (output_symbol *)0x0;
    this->m_size = 0;
    this->m_capacity = 0;
  }
  return;
}

Assistant:

inline void clear()
        {
            if (m_p)
            {
                scalar_type<T>::destruct_array(m_p, m_size);
                crnlib_free(m_p);
                m_p = nullptr;
                m_size = 0;
                m_capacity = 0;
            }
        }